

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

string * __thiscall
jaegertracing::net::IPAddress::authority_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  int __val;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  __val = port(this);
  if (__val == 0) {
    host_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    host_abi_cxx11_(&local_40,this);
    std::operator+(&local_60,&local_40,':');
    std::__cxx11::to_string(&local_80,__val);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string authority() const
    {
        const auto portNum = port();
        if (portNum != 0) {
            return host() + ':' + std::to_string(portNum);
        }
        return host();
    }